

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.h
# Opt level: O2

bool __thiscall
absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<double>
          (FormatArgImpl *this,Data arg,FormatConversionSpecImpl spec,void *out)

{
  StringConvertResult SVar1;
  uint uVar2;
  FormatConversionSpecImpl conv;
  
  if (((FormatSinkImpl *)((ulong)arg.ptr & 0xff) == (FormatSinkImpl *)&DAT_00000013) ||
     ((2L << (arg.buf[0] & 0x3f) & 0x9fe00U) == 0)) {
    SVar1.value = false;
  }
  else {
    uVar2 = spec._0_4_;
    conv.width_ = 0;
    conv.conv_ = (char)uVar2;
    conv.flags_ = (char)(uVar2 >> 8);
    conv.length_mod_ = (char)(uVar2 >> 0x10);
    conv._3_1_ = (char)(uVar2 >> 0x18);
    conv.precision_ = spec.precision_;
    SVar1 = str_format_internal::FormatConvertImpl
                      ((str_format_internal *)arg.ptr,(double)this,conv,
                       (FormatSinkImpl *)((ulong)arg.ptr & 0xff));
  }
  return (bool)(SVar1.value & 1);
}

Assistant:

static bool Dispatch(Data arg, FormatConversionSpecImpl spec, void* out) {
    // A `none` conv indicates that we want the `int` conversion.
    if (ABSL_PREDICT_FALSE(spec.conversion_char() ==
                           FormatConversionCharInternal::kNone)) {
      return ToInt<T>(arg, static_cast<int*>(out), std::is_integral<T>(),
                      std::is_enum<T>());
    }
    if (ABSL_PREDICT_FALSE(!Contains(ArgumentToConv<T>(),
                                     spec.conversion_char()))) {
      return false;
    }
    return str_format_internal::FormatConvertImpl(
               Manager<T>::Value(arg), spec,
               static_cast<FormatSinkImpl*>(out))
        .value;
  }